

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_initDStream_usingDict(ZSTD_DStream *zds,void *dict,size_t dictSize)

{
  uint uVar1;
  size_t err_code_1;
  size_t err_code;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_DStream *zds_local;
  
  zds_local = (ZSTD_DStream *)ZSTD_DCtx_reset(zds,ZSTD_reset_session_only);
  uVar1 = ERR_isError((size_t)zds_local);
  if (uVar1 == 0) {
    zds_local = (ZSTD_DStream *)ZSTD_DCtx_loadDictionary(zds,dict,dictSize);
    uVar1 = ERR_isError((size_t)zds_local);
    if (uVar1 == 0) {
      zds_local = (ZSTD_DStream *)ZSTD_startingInputLength(zds->format);
    }
  }
  return (size_t)zds_local;
}

Assistant:

size_t ZSTD_initDStream_usingDict(ZSTD_DStream* zds, const void* dict, size_t dictSize)
{
    DEBUGLOG(4, "ZSTD_initDStream_usingDict");
    FORWARD_IF_ERROR( ZSTD_DCtx_reset(zds, ZSTD_reset_session_only) );
    FORWARD_IF_ERROR( ZSTD_DCtx_loadDictionary(zds, dict, dictSize) );
    return ZSTD_startingInputLength(zds->format);
}